

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateForwardDeclarations
          (FileGenerator *this,Printer *printer)

{
  cpp *pcVar1;
  _Rb_tree_node_base *p_Var2;
  size_type sVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  Options *pOVar6;
  int i;
  ulong uVar7;
  int i_1;
  Options *pOVar8;
  Options *options;
  vector<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  enums;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  classes;
  NamespaceOpener ns;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  public_set;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  decls;
  Formatter format;
  _Vector_base<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  local_138;
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_118;
  string local_f8;
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  local_98;
  Formatter local_68;
  
  local_68.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_68.vars_._M_t,&(this->variables_)._M_t);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FlattenMessagesInFile
            (this->file_,
             (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)&local_118);
  if ((this->options_).proto_h == true) {
    local_d8._M_buckets = (__buckets_ptr)0x0;
    local_d8._M_bucket_count = 0;
    local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    ListAllFields(this->file_,
                  (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&local_d8);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)(local_d8._M_bucket_count - (long)local_d8._M_buckets) >> 3);
        uVar7 = uVar7 + 1) {
      local_98._M_impl._0_8_ = local_d8._M_buckets[uVar7][10]._M_nxt;
      std::
      vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
      ::emplace_back<google::protobuf::Descriptor_const*>
                ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&local_118,(Descriptor **)&local_98);
      local_98._M_impl._0_8_ =
           FieldDescriptor::message_type((FieldDescriptor *)local_d8._M_buckets[uVar7]);
      std::
      vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
      ::emplace_back<google::protobuf::Descriptor_const*>
                ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&local_118,(Descriptor **)&local_98);
      local_98._M_impl._0_8_ =
           FieldDescriptor::enum_type((FieldDescriptor *)local_d8._M_buckets[uVar7]);
      std::
      vector<google::protobuf::EnumDescriptor_const*,std::allocator<google::protobuf::EnumDescriptor_const*>>
      ::emplace_back<google::protobuf::EnumDescriptor_const*>
                ((vector<google::protobuf::EnumDescriptor_const*,std::allocator<google::protobuf::EnumDescriptor_const*>>
                  *)&local_138,(EnumDescriptor **)&local_98);
    }
    ListAllTypesForServices
              (this->file_,
               (vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)&local_118);
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&local_d8);
  }
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  PublicImportDFS(this->file_,
                  (unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&local_d8);
  options = &this->options_;
  p_Var2 = (_Rb_tree_node_base *)((long)&local_98 + 8);
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar8 = (Options *)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  while( true ) {
    pOVar6 = (Options *)
             ((long)local_118._M_impl.super__Vector_impl_data._M_finish -
              (long)local_118._M_impl.super__Vector_impl_data._M_start >> 3);
    if (pOVar6 <= pOVar8) break;
    pcVar1 = (cpp *)local_118._M_impl.super__Vector_impl_data._M_start[(long)pOVar8];
    if (pcVar1 != (cpp *)0x0) {
      local_f8._M_dataplus._M_p = *(pointer *)(pcVar1 + 0x10);
      sVar3 = std::
              _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&local_d8,(key_type *)&local_f8);
      if (sVar3 == 0) {
        Namespace_abi_cxx11_(&local_f8,pcVar1,(Descriptor *)options,pOVar6);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                               *)&local_98,&local_f8);
        ForwardDeclarations::AddMessage(pmVar4,(Descriptor *)pcVar1);
        std::__cxx11::string::~string((string *)&local_f8);
      }
    }
    pOVar8 = (Options *)((long)&(pOVar8->dllexport_decl)._M_dataplus._M_p + 1);
  }
  pOVar8 = (Options *)0x0;
  while( true ) {
    pOVar6 = (Options *)
             ((long)local_138._M_impl.super__Vector_impl_data._M_finish -
              (long)local_138._M_impl.super__Vector_impl_data._M_start >> 3);
    if (pOVar6 <= pOVar8) break;
    pcVar1 = (cpp *)local_138._M_impl.super__Vector_impl_data._M_start[(long)pOVar8];
    if (pcVar1 != (cpp *)0x0) {
      local_f8._M_dataplus._M_p = *(pointer *)(pcVar1 + 0x10);
      sVar3 = std::
              _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&local_d8,(key_type *)&local_f8);
      if (sVar3 == 0) {
        Namespace_abi_cxx11_(&local_f8,pcVar1,(EnumDescriptor *)options,pOVar6);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
                               *)&local_98,&local_f8);
        ForwardDeclarations::AddEnum(pmVar4,(EnumDescriptor *)pcVar1);
        std::__cxx11::string::~string((string *)&local_f8);
      }
    }
    pOVar8 = (Options *)((long)&(pOVar8->dllexport_decl)._M_dataplus._M_p + 1);
  }
  local_f8._M_dataplus._M_p = &(local_68.printer_)->variable_delimiter_;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  local_f8.field_2._8_8_ = 0;
  for (p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_left; p_Var5 != p_Var2;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    NamespaceOpener::ChangeTo((NamespaceOpener *)&local_f8,(string *)(p_Var5 + 1));
    ForwardDeclarations::Print((ForwardDeclarations *)(p_Var5 + 2),&local_68,options);
  }
  NamespaceOpener::~NamespaceOpener((NamespaceOpener *)&local_f8);
  Formatter::operator()<>(&local_68,"PROTOBUF_NAMESPACE_OPEN\n");
  for (p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_left; p_Var5 != p_Var2;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    ForwardDeclarations::PrintTopLevelDecl((ForwardDeclarations *)(p_Var5 + 2),&local_68,options);
  }
  Formatter::operator()<>(&local_68,"PROTOBUF_NAMESPACE_CLOSE\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>_>
  ::~_Rb_tree(&local_98);
  std::
  _Hashtable<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_d8);
  std::
  _Vector_base<const_google::protobuf::EnumDescriptor_*,_std::allocator<const_google::protobuf::EnumDescriptor_*>_>
  ::~_Vector_base(&local_138);
  std::
  _Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Vector_base(&local_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateForwardDeclarations(io::Printer* printer) {
  Formatter format(printer, variables_);
  std::vector<const Descriptor*> classes;
  std::vector<const EnumDescriptor*> enums;

  FlattenMessagesInFile(file_, &classes);  // All messages need forward decls.

  if (options_.proto_h) {  // proto.h needs extra forward declarations.
    // All classes / enums refered to as field members
    std::vector<const FieldDescriptor*> fields;
    ListAllFields(file_, &fields);
    for (int i = 0; i < fields.size(); i++) {
      classes.push_back(fields[i]->containing_type());
      classes.push_back(fields[i]->message_type());
      enums.push_back(fields[i]->enum_type());
    }
    ListAllTypesForServices(file_, &classes);
  }

  // Calculate the set of files whose definitions we get through include.
  // No need to forward declare types that are defined in these.
  std::unordered_set<const FileDescriptor*> public_set;
  PublicImportDFS(file_, &public_set);

  std::map<std::string, ForwardDeclarations> decls;
  for (int i = 0; i < classes.size(); i++) {
    const Descriptor* d = classes[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddMessage(d);
  }
  for (int i = 0; i < enums.size(); i++) {
    const EnumDescriptor* d = enums[i];
    if (d && !public_set.count(d->file()))
      decls[Namespace(d, options_)].AddEnum(d);
  }


  {
    NamespaceOpener ns(format);
    for (const auto& pair : decls) {
      ns.ChangeTo(pair.first);
      pair.second.Print(format, options_);
    }
  }
  format("PROTOBUF_NAMESPACE_OPEN\n");
  for (const auto& pair : decls) {
    pair.second.PrintTopLevelDecl(format, options_);
  }
  format("PROTOBUF_NAMESPACE_CLOSE\n");
}